

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O0

void add_quad(double x,double y,double z,double u,double v,double ux,double uy,double uz,double uu,
             double uv,double vx,double vy,double vz,double vu,double vv,ALLEGRO_COLOR c1,
             ALLEGRO_COLOR c2)

{
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  ALLEGRO_COLOR color_02;
  ALLEGRO_COLOR color_03;
  ALLEGRO_COLOR color_04;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double *v_00;
  double *u_00;
  
  u_00 = &x;
  v_00 = &z;
  color._8_8_ = in_XMM3_Qa;
  color._0_8_ = in_XMM4_Qa;
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color);
  color_00.b = (float)(int)in_XMM3_Qa;
  color_00.a = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  color_00.r = (float)(int)in_XMM4_Qa;
  color_00.g = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color_00);
  color_01.b = (float)(int)in_XMM3_Qa;
  color_01.a = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  color_01.r = (float)(int)in_XMM4_Qa;
  color_01.g = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color_01);
  color_02.b = (float)(int)in_XMM3_Qa;
  color_02.a = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  color_02.r = (float)(int)in_XMM4_Qa;
  color_02.g = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color_02);
  color_03.b = (float)(int)in_XMM3_Qa;
  color_03.a = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  color_03.r = (float)(int)in_XMM4_Qa;
  color_03.g = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color_03);
  color_04.b = (float)(int)in_XMM3_Qa;
  color_04.a = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  color_04.r = (float)(int)in_XMM4_Qa;
  color_04.g = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  add_vertex(in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,(double)u_00,(double)v_00,color_04);
  return;
}

Assistant:

static void add_quad(double x, double y, double z, double u, double v,
   double ux, double uy, double uz, double uu, double uv,
   double vx, double vy, double vz, double vu, double vv,
   ALLEGRO_COLOR c1, ALLEGRO_COLOR c2)
{
   add_vertex(x, y, z, u, v, c1);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + ux + vx, y + uy + vy, z + uz + vz, u + uu + vu,
      v + uv + vv, c2);
}